

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O0

void RadialFetchPlain<GradientBase64>::fetch
               (BlendType *buffer,BlendType *end,Operator *op,QSpanData *data,qreal det,
               qreal delta_det,qreal delta_delta_det,qreal b,qreal delta_b)

{
  long lVar1;
  long in_RCX;
  long in_RDX;
  quint64 *in_RSI;
  quint64 *in_RDI;
  long in_FS_OFFSET;
  double in_XMM0_Qa;
  double dVar2;
  double in_XMM1_Qa;
  double in_XMM2_Qa;
  double in_XMM3_Qa;
  double in_XMM4_Qa;
  qreal w_1;
  qreal w;
  BlendType result_1;
  BlendType result;
  qreal in_stack_ffffffffffffff78;
  QGradientData *in_stack_ffffffffffffff80;
  double local_68;
  double local_58;
  double local_50;
  quint64 *local_30;
  quint64 local_20;
  quint64 local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_68 = in_XMM3_Qa;
  local_58 = in_XMM1_Qa;
  local_50 = in_XMM0_Qa;
  local_30 = in_RDI;
  if ((*(byte *)(in_RDX + 0xa8) & 1) == 0) {
    while (local_30 < in_RSI) {
      local_20 = (quint64)GradientBase64::null();
      if (0.0 <= local_50) {
        dVar2 = qSqrt<double>(5.9553348853773e-317);
        local_20 = (quint64)GradientBase64::fetchSingle
                                      ((QGradientData *)(dVar2 - local_68),in_stack_ffffffffffffff78
                                      );
      }
      *local_30 = local_20;
      local_50 = local_58 + local_50;
      local_58 = in_XMM2_Qa + local_58;
      local_68 = in_XMM4_Qa + local_68;
      local_30 = local_30 + 1;
    }
  }
  else {
    for (; local_30 < in_RSI; local_30 = local_30 + 1) {
      local_10 = (quint64)GradientBase64::null();
      if ((0.0 <= local_50) &&
         (dVar2 = qSqrt<double>(5.95520741644067e-317),
         0.0 <= *(double *)(in_RDX + 0x90) * (dVar2 - local_68) + *(double *)(in_RCX + 0xd8))) {
        local_10 = (quint64)GradientBase64::fetchSingle
                                      (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      }
      *local_30 = local_10;
      local_50 = local_58 + local_50;
      local_58 = in_XMM2_Qa + local_58;
      local_68 = in_XMM4_Qa + local_68;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void fetch(BlendType *buffer, BlendType *end,
                      const Operator *op, const QSpanData *data, qreal det,
                      qreal delta_det, qreal delta_delta_det, qreal b, qreal delta_b)
    {
        if (op->radial.extended) {
            while (buffer < end) {
                BlendType result = GradientBase::null();
                if (det >= 0) {
                    qreal w = qSqrt(det) - b;
                    if (data->gradient.radial.focal.radius + op->radial.dr * w >= 0)
                        result = GradientBase::fetchSingle(data->gradient, w);
                }

                *buffer = result;

                det += delta_det;
                delta_det += delta_delta_det;
                b += delta_b;

                ++buffer;
            }
        } else {
            while (buffer < end) {
                BlendType result = GradientBase::null();
                if (det >= 0) {
                    qreal w = qSqrt(det) - b;
                    result = GradientBase::fetchSingle(data->gradient, w);
                }

                *buffer++ = result;

                det += delta_det;
                delta_det += delta_delta_det;
                b += delta_b;
            }
        }
    }